

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_setalarm(int microsec)

{
  undefined1 auStack_30 [4];
  int sec;
  itimerval gonzo;
  int microsec_local;
  
  gonzo.it_value.tv_usec._4_4_ = microsec % 1000000;
  _auStack_30 = 0;
  gonzo.it_interval.tv_sec = 0;
  gonzo.it_interval.tv_usec = (__suseconds_t)(microsec / 1000000);
  gonzo.it_value.tv_sec = (__time_t)gonzo.it_value.tv_usec._4_4_;
  if (gonzo.it_value.tv_usec._4_4_ == 0) {
    sys_signal(0xe,(sig_t)&DAT_00000001);
  }
  else {
    sys_signal(0xe,sys_alarmhandler);
  }
  setitimer(ITIMER_REAL,(itimerval *)auStack_30,(itimerval *)0x0);
  return;
}

Assistant:

void sys_setalarm(int microsec)
{
    struct itimerval gonzo;
    int sec = (int)(microsec/1000000);
    microsec %= 1000000;
#if 0
    fprintf(stderr, "timer %d:%d\n", sec, microsec);
#endif
    gonzo.it_interval.tv_sec = 0;
    gonzo.it_interval.tv_usec = 0;
    gonzo.it_value.tv_sec = sec;
    gonzo.it_value.tv_usec = microsec;
    if (microsec)
        sys_signal(SIGALRM, sys_alarmhandler);
    else sys_signal(SIGALRM, SIG_IGN);
    setitimer(ITIMER_REAL, &gonzo, 0);
}